

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

bool __thiscall
helics::NetworkCommsInterface::PortAllocator::isPortUsed
          (PortAllocator *this,string_view host,int port)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator __x;
  size_type sVar2;
  const_iterator fnd;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  bool local_1;
  
  this_00 = std::
            map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::find(in_stack_ffffffffffffffb8,(key_type *)0x4e504f);
  __x = std::
        map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
        ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffd0,(_Self *)&stack0xffffffffffffffc8);
  if (bVar1) {
    local_1 = false;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)0x4e508d);
    sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00._M_node,
                       (key_type *)__x._M_node);
    local_1 = sVar2 != 0;
  }
  return local_1;
}

Assistant:

bool NetworkCommsInterface::PortAllocator::isPortUsed(std::string_view host, int port) const
{
    auto fnd = usedPort.find(host);
    if (fnd == usedPort.end()) {
        return false;
    }
    return (fnd->second.count(port) != 0);
}